

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalSetThreadPriority
                    (CPalThread *pThread,HANDLE hTargetThread,int iNewPriority)

{
  uint uVar1;
  FILE *__stream;
  THREAD_STATE TVar2;
  int iVar3;
  int iVar4;
  pthread_t pVar5;
  uint *puVar6;
  int *piVar7;
  char *pcVar8;
  float fVar9;
  float posix_priority;
  int min_priority;
  int max_priority;
  sched_param schedParam;
  int policy;
  int st;
  IPalObject *pobjThread;
  CPalThread *pTargetThread;
  PAL_ERROR palError;
  int iNewPriority_local;
  HANDLE hTargetThread_local;
  CPalThread *pThread_local;
  
  pTargetThread._0_4_ = 0;
  pobjThread = (IPalObject *)0x0;
  _policy = (IPalObject *)0x0;
  pTargetThread._4_4_ = iNewPriority;
  _palError = hTargetThread;
  hTargetThread_local = pThread;
  pTargetThread._0_4_ =
       InternalGetThreadDataFromHandle
                 (pThread,hTargetThread,0,(CPalThread **)&pobjThread,(IPalObject **)&policy);
  if ((PAL_ERROR)pTargetThread == 0) {
    CPalThread::Lock((CPalThread *)pobjThread,(CPalThread *)hTargetThread_local);
    if (((pTargetThread._4_4_ == 0xfffffff1) || (pTargetThread._4_4_ + 2 < 5)) ||
       (pTargetThread._4_4_ == 0xf)) {
      TVar2 = CThreadSynchronizationInfo::GetThreadState
                        ((CThreadSynchronizationInfo *)(pobjThread + 0x2e));
      if (TVar2 == TS_DONE) {
        *(uint *)((long)&pobjThread[0x1d]._vptr_IPalObject + 4) = pTargetThread._4_4_;
      }
      else {
        pVar5 = CPalThread::GetPThreadSelf((CPalThread *)pobjThread);
        iVar3 = pthread_getschedparam(pVar5,&max_priority,(sched_param *)&min_priority);
        if (iVar3 == 0) {
          if (max_priority == 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              abort();
            }
          }
          else {
            iVar3 = sched_get_priority_max(max_priority);
            iVar4 = sched_get_priority_min(max_priority);
            if ((iVar3 == -1) || (iVar4 == -1)) {
              fprintf(_stderr,"] %s %s:%d","InternalSetThreadPriority",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
                      ,0x459);
              __stream = _stderr;
              puVar6 = (uint *)__errno_location();
              uVar1 = *puVar6;
              piVar7 = __errno_location();
              pcVar8 = strerror(*piVar7);
              fprintf(__stream,"sched_get_priority_min/max failed; error is %d (%s)\n",(ulong)uVar1,
                      pcVar8);
              pTargetThread._0_4_ = 0x54f;
            }
            else {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              fVar9 = (float)iVar4 +
                      (float)(iVar3 - iVar4) * ((float)(int)(pTargetThread._4_4_ + 0xf) / 30.0);
              min_priority = (int)fVar9;
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              pVar5 = CPalThread::GetPThreadSelf((CPalThread *)pobjThread);
              schedParam.sched_priority =
                   pthread_setschedparam(pVar5,max_priority,(sched_param *)&min_priority);
              if (schedParam.sched_priority == 0) {
                *(uint *)((long)&pobjThread[0x1d]._vptr_IPalObject + 4) = pTargetThread._4_4_;
              }
              else {
                fprintf(_stderr,"] %s %s:%d","InternalSetThreadPriority",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
                        ,0x496);
                fprintf(_stderr,"Unable to set thread priority to %d (error %d)\n",
                        (ulong)(uint)(int)fVar9,(ulong)(uint)schedParam.sched_priority);
                pTargetThread._0_4_ = 0x54f;
              }
            }
          }
        }
        else {
          fprintf(_stderr,"] %s %s:%d","InternalSetThreadPriority",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
                  ,0x443);
          fprintf(_stderr,"Unable to get current thread scheduling information\n");
          pTargetThread._0_4_ = 0x54f;
        }
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","InternalSetThreadPriority",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/pal_thread.cpp"
              ,0x42d);
      fprintf(_stderr,"Priority %d not supported\n",(ulong)pTargetThread._4_4_);
      pTargetThread._0_4_ = 0x57;
    }
  }
  if (pobjThread != (IPalObject *)0x0) {
    CPalThread::Unlock((CPalThread *)pobjThread,(CPalThread *)hTargetThread_local);
  }
  if (_policy != (IPalObject *)0x0) {
    (*_policy->_vptr_IPalObject[8])(_policy,hTargetThread_local);
  }
  return (PAL_ERROR)pTargetThread;
}

Assistant:

PAL_ERROR
CorUnix::InternalSetThreadPriority(
    CPalThread *pThread,
    HANDLE hTargetThread,
    int iNewPriority
    )
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pTargetThread = NULL;
    IPalObject *pobjThread = NULL;

    int st;
    int policy;
    struct sched_param schedParam;
    int max_priority;
    int min_priority;
    float posix_priority;


    palError = InternalGetThreadDataFromHandle(
        pThread,
        hTargetThread,
        0, // THREAD_SET_INFORMATION
        &pTargetThread,
        &pobjThread
        );

    if (NO_ERROR != palError)
    {
        goto InternalSetThreadPriorityExit;
    }

    pTargetThread->Lock(pThread);

    /* validate the requested priority */
    switch (iNewPriority)
    {
    case THREAD_PRIORITY_TIME_CRITICAL: /* fall through */
    case THREAD_PRIORITY_IDLE:
        break;

    case THREAD_PRIORITY_HIGHEST:       /* fall through */
    case THREAD_PRIORITY_ABOVE_NORMAL:  /* fall through */
    case THREAD_PRIORITY_NORMAL:        /* fall through */
    case THREAD_PRIORITY_BELOW_NORMAL:  /* fall through */
    case THREAD_PRIORITY_LOWEST:
#if PAL_IGNORE_NORMAL_THREAD_PRIORITY
        /* We aren't going to set the thread priority. Just record what it is,
           and exit */
        pTargetThread->m_iThreadPriority = iNewPriority;
        goto InternalSetThreadPriorityExit;
#endif
        break;

    default:
        ASSERT("Priority %d not supported\n", iNewPriority);
        palError = ERROR_INVALID_PARAMETER;
        goto InternalSetThreadPriorityExit;
    }

    /* check if the thread is still running */
    if (TS_DONE == pTargetThread->synchronizationInfo.GetThreadState())
    {
        /* the thread has exited, set the priority in the thread structure
           and exit */
        pTargetThread->m_iThreadPriority = iNewPriority;
        goto InternalSetThreadPriorityExit;
    }

    /* get the previous thread schedule parameters.  We need to know the
       scheduling policy to determine the priority range */
    if (pthread_getschedparam(
            pTargetThread->GetPThreadSelf(),
            &policy,
            &schedParam
            ) != 0)
    {
        ASSERT("Unable to get current thread scheduling information\n");
        palError = ERROR_INTERNAL_ERROR;
        goto InternalSetThreadPriorityExit;
    }

#if !HAVE_SCHED_OTHER_ASSIGNABLE
    /* Defining thread priority for SCHED_OTHER is implementation defined.
       Some platforms like NetBSD cannot reassign it as they are dynamic.
    */
    if (policy == SCHED_OTHER)
    {
        TRACE("Pthread priority levels for SCHED_OTHER cannot be reassigned on this platform\n");
        goto InternalSetThreadPriorityExit;
    }
#endif

#if HAVE_SCHED_GET_PRIORITY
    max_priority = sched_get_priority_max(policy);
    min_priority = sched_get_priority_min(policy);
    if( -1 == max_priority || -1 == min_priority)
    {
        ASSERT("sched_get_priority_min/max failed; error is %d (%s)\n",
               errno, strerror(errno));
        palError = ERROR_INTERNAL_ERROR;
        goto InternalSetThreadPriorityExit;
    }
#else
    max_priority = PAL_THREAD_PRIORITY_MAX;
    min_priority = PAL_THREAD_PRIORITY_MIN;
#endif

    TRACE("Pthread priorities for policy %d must be in the range %d to %d\n",
          policy, min_priority, max_priority);

    /* explanation for fancy maths below :
       POSIX doesn't specify the range of thread priorities that can be used
       with pthread_setschedparam. Instead, one must use sched_get_priority_min
       and sched_get_priority_max to obtain the lower and upper bounds of this
       range. Since the PAL also uses a range of values (from Idle [-15] to
       Time Critical [+15]), we have to do a mapping from a known range to an
       unknown (at compilation) range.
       We do this by :
       -subtracting the minimal PAL priority from the desired priority. this
        gives a value between 0 and the PAL priority range
       -dividing this value by the PAL priority range. this allows us to
        express the desired priority as a floating-point value between 0 and 1
       -multiplying this value by the PTHREAD priority range. This gives a
        value between 0 and the PTHREAD priority range
       -adding the minimal PTHREAD priority range. This will give us a value
        between the minimal and maximla pthread priority, which should be
        equivalent to the original PAL value.

        example : suppose a pthread range 100 to 200, and a desired priority
                  of 0 (halfway between PAL minimum and maximum)
            0 - (IDLE [-15]) = 15
            15 / (TIMECRITICAL[15] - IDLE[-15]) = 0.5
            0.5 * (pthreadmax[200]-pthreadmin[100]) = 50
            50 + pthreadmin[100] = 150 -> halfway between pthread min and max
    */
    posix_priority =  (iNewPriority - THREAD_PRIORITY_IDLE);
    posix_priority /= (THREAD_PRIORITY_TIME_CRITICAL - THREAD_PRIORITY_IDLE);
    posix_priority *= (max_priority-min_priority);
    posix_priority += min_priority;

    schedParam.sched_priority = (int)posix_priority;

    TRACE("PAL priority %d is mapped to pthread priority %d\n",
          iNewPriority, schedParam.sched_priority);

    /* Finally, set the new priority into place */
    st = pthread_setschedparam(pTargetThread->GetPThreadSelf(), policy, &schedParam);
    if (st != 0)
    {
#if SET_SCHEDPARAM_NEEDS_PRIVS
        if (EPERM == st)
        {
            // UNIXTODO: Should log a warning to the event log
            TRACE("Caller does not have OS privileges to call pthread_setschedparam\n");
            pTargetThread->m_iThreadPriority = iNewPriority;
            goto InternalSetThreadPriorityExit;
        }
#endif

        ASSERT("Unable to set thread priority to %d (error %d)\n", (int)posix_priority, st);
        palError = ERROR_INTERNAL_ERROR;
        goto InternalSetThreadPriorityExit;
    }

    pTargetThread->m_iThreadPriority = iNewPriority;

InternalSetThreadPriorityExit:

    if (NULL != pTargetThread)
    {
        pTargetThread->Unlock(pThread);
    }

    if (NULL != pobjThread)
    {
        pobjThread->ReleaseReference(pThread);
    }

    return palError;
}